

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_importUnitsMultipleWaysSameDocument_Test::~Units_importUnitsMultipleWaysSameDocument_Test
          (Units_importUnitsMultipleWaysSameDocument_Test *this)

{
  Units_importUnitsMultipleWaysSameDocument_Test *this_local;
  
  ~Units_importUnitsMultipleWaysSameDocument_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, importUnitsMultipleWaysSameDocument)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ImporterPtr importer = libcellml::Importer::create();

    auto model = parser->parseModel(fileContents("importer/units/main.cellml"));

    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("importer/units"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(flatModel);
    EXPECT_EQ(size_t(2), analyser->issueCount());
}